

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DebugNodeWindow(ImGuiWindow *window,char *label)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ImGuiWindow *pIVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ImDrawList *pIVar7;
  char *pcVar8;
  ulong uVar9;
  uint uVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  int n;
  char *pcVar18;
  long lVar19;
  long lVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  ImVec2 local_68;
  ImVec2 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (window != (ImGuiWindow *)0x0) {
    bVar6 = window->WasActive;
    pIVar3 = GImGui->NavWindow;
    if (bVar6 == false) {
      PushStyleColor(0,(GImGui->Style).Colors + 1);
      pcVar12 = " *Inactive*";
    }
    else {
      pcVar12 = "";
    }
    bVar4 = TreeNodeEx(label,(uint)(pIVar3 == window),"%s \'%s\'%s",label,window->Name,pcVar12);
    if (bVar6 == false) {
      PopStyleColor(1);
    }
    bVar5 = IsItemHovered(0);
    if ((bVar5 & bVar6) == 1) {
      pIVar7 = GetForegroundDrawList();
      local_68.x = (window->Size).x + (window->Pos).x;
      local_68.y = (window->Size).y + (window->Pos).y;
      ImDrawList::AddRect(pIVar7,&window->Pos,&local_68,0xff00ffff,0.0,0,1.0);
    }
    if (bVar4) {
      if (window->MemoryCompacted == true) {
        TextDisabled("Note: some memory buffers have been compacted/freed.");
      }
      uVar10 = window->Flags;
      DebugNodeDrawList(window,window->DrawList,"DrawList");
      BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)",
                 (double)(window->Pos).x,(double)(window->Pos).y,SUB84((double)(window->Size).x,0),
                 (double)(window->Size).y,(double)(window->ContentSize).x,
                 (double)(window->ContentSize).y,(double)(window->ContentSizeIdeal).x,
                 (double)(window->ContentSizeIdeal).y);
      pcVar12 = "Child ";
      if ((uVar10 >> 0x18 & 1) == 0) {
        pcVar12 = "";
      }
      auVar24._0_4_ = -(uint)((uVar10 & 0x10000000) == 0);
      auVar24._4_4_ = -(uint)((uVar10 & 0x8000000) == 0);
      auVar24._8_4_ = -(uint)((uVar10 & 0x4000000) == 0);
      auVar24._12_4_ = -(uint)((uVar10 & 0x2000000) == 0);
      auVar23._0_4_ = -(uint)((uVar10 & 0x40) == 0);
      auVar23._4_4_ = -(uint)((uVar10 & 0x40000) == 0);
      auVar23._8_4_ = -(uint)((uVar10 & 0x200) == 0);
      auVar23._12_4_ = -(uint)((uVar10 & 0x100) == 0);
      auVar24 = packssdw(auVar23,auVar24);
      auVar24 = packsswb(auVar24,auVar24);
      pcVar8 = "Tooltip ";
      if ((auVar24 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar8 = "";
      }
      pcVar11 = "Popup ";
      if ((auVar24 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar11 = "";
      }
      pcVar13 = "Modal ";
      if ((auVar24 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar13 = "";
      }
      pcVar14 = "ChildMenu ";
      if ((auVar24 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar14 = "";
      }
      pcVar15 = "NoSavedSettings ";
      if ((auVar24 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar15 = "";
      }
      pcVar18 = "NoMouseInputs";
      if ((auVar24 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar18 = "";
      }
      pcVar16 = "NoNavInputs";
      if ((auVar24 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar16 = "";
      }
      pcVar17 = "AlwaysAutoResize";
      if ((auVar24 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar17 = "";
      }
      BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)",(ulong)uVar10,pcVar12,pcVar8,pcVar11,pcVar13
                 ,pcVar14,pcVar15,pcVar18,pcVar16,pcVar17);
      pcVar12 = "X";
      if (window->ScrollbarX == false) {
        pcVar12 = "";
      }
      pcVar8 = "Y";
      if (window->ScrollbarY == false) {
        pcVar8 = "";
      }
      BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s",(double)(window->Scroll).x,
                 (double)(window->ScrollMax).x,SUB84((double)(window->Scroll).y,0),
                 (double)(window->ScrollMax).y,pcVar12,pcVar8);
      if ((window->Active == false) && (window->WasActive == false)) {
        uVar9 = 0xffffffffffffffff;
      }
      else {
        uVar9 = (ulong)(uint)(int)window->BeginOrderWithinContext;
      }
      BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d",
                 (ulong)window->Active,(ulong)window->WasActive,(ulong)window->WriteAccessed,uVar9);
      BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d",
                 (ulong)window->Appearing,(ulong)window->Hidden,
                 (ulong)(uint)(int)window->HiddenFramesCanSkipItems,
                 (ulong)(uint)(int)window->HiddenFramesCannotSkipItems,(ulong)window->SkipItems);
      uVar10 = 0;
      for (lVar19 = 0x378; lVar19 != 0x380; lVar19 = lVar19 + 4) {
        uVar1 = *(undefined8 *)((long)window + lVar19 * 4 + -0xa60);
        uVar2 = *(undefined8 *)((long)window + lVar19 * 4 + -0xa58);
        fVar22 = (float)((ulong)uVar2 >> 0x20);
        fVar21 = (float)((ulong)uVar1 >> 0x20);
        uVar9 = (ulong)*(uint *)((long)&window->Name + lVar19);
        if (((float)uVar1 < fVar22) || (fVar21 < fVar22)) {
          uStack_50 = 0;
          uStack_40 = 0;
          local_58 = uVar1;
          local_48 = uVar2;
          BulletText("NavLastIds[%d]: 0x%08X at +(%.1f,%.1f)(%.1f,%.1f)",(double)(float)uVar1,
                     (double)fVar21,SUB84((double)(float)uVar2,0),(double)fVar22,(ulong)uVar10,uVar9
                    );
          bVar6 = IsItemHovered(0);
          if (bVar6) {
            pIVar7 = GetForegroundDrawList();
            fVar21 = (window->Pos).x;
            local_68.x = (float)local_58 + fVar21;
            fVar22 = (window->Pos).y;
            local_68.y = local_58._4_4_ + fVar22;
            local_60.x = (float)local_48 + fVar21;
            local_60.y = local_48._4_4_ + fVar22;
            ImDrawList::AddRect(pIVar7,&local_68,&local_60,0xff00ffff,0.0,0,1.0);
          }
        }
        else {
          BulletText("NavLastIds[%d]: 0x%08X",(ulong)uVar10,uVar9);
        }
        uVar10 = uVar10 + 1;
      }
      if (window->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
        pcVar12 = "NULL";
      }
      else {
        pcVar12 = window->NavLastChildNavWindow->Name;
      }
      BulletText("NavLayersActiveMask: %X, NavLastChildNavWindow: %s",
                 (ulong)(uint)(int)(window->DC).NavLayersActiveMask,pcVar12);
      if (window->RootWindow != window) {
        DebugNodeWindow(window->RootWindow,"RootWindow");
      }
      if (window->ParentWindow != (ImGuiWindow *)0x0) {
        DebugNodeWindow(window->ParentWindow,"ParentWindow");
      }
      if (0 < (window->DC).ChildWindows.Size) {
        DebugNodeWindowsList(&(window->DC).ChildWindows,"ChildWindows");
      }
      if (0 < (window->ColumnsStorage).Size) {
        bVar6 = TreeNode("Columns","Columns sets (%d)");
        if (bVar6) {
          lVar19 = 0;
          for (lVar20 = 0; lVar20 < (window->ColumnsStorage).Size; lVar20 = lVar20 + 1) {
            DebugNodeColumns((ImGuiOldColumns *)
                             ((long)&((window->ColumnsStorage).Data)->ID + lVar19));
            lVar19 = lVar19 + 0x88;
          }
          TreePop();
        }
      }
      DebugNodeStorage(&window->StateStorage,"Storage");
      TreePop();
    }
    return;
  }
  BulletText("%s: NULL",label);
  return;
}

Assistant:

void ImGui::DebugNodeWindow(ImGuiWindow* window, const char* label)
{
    if (window == NULL)
    {
        BulletText("%s: NULL", label);
        return;
    }

    ImGuiContext& g = *GImGui;
    const bool is_active = window->WasActive;
    ImGuiTreeNodeFlags tree_node_flags = (window == g.NavWindow) ? ImGuiTreeNodeFlags_Selected : ImGuiTreeNodeFlags_None;
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    const bool open = TreeNodeEx(label, tree_node_flags, "%s '%s'%s", label, window->Name, is_active ? "" : " *Inactive*");
    if (!is_active) { PopStyleColor(); }
    if (IsItemHovered() && is_active)
        GetForegroundDrawList(window)->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!open)
        return;

    if (window->MemoryCompacted)
        TextDisabled("Note: some memory buffers have been compacted/freed.");

    ImGuiWindowFlags flags = window->Flags;
    DebugNodeDrawList(window, window->DrawList, "DrawList");
    BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y, window->ContentSizeIdeal.x, window->ContentSizeIdeal.y);
    BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
        (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
        (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
        (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
    BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y, window->ScrollbarX ? "X" : "", window->ScrollbarY ? "Y" : "");
    BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
    BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
    for (int layer = 0; layer < ImGuiNavLayer_COUNT; layer++)
    {
        ImRect r = window->NavRectRel[layer];
        if (r.Min.x >= r.Max.y && r.Min.y >= r.Max.y)
        {
            BulletText("NavLastIds[%d]: 0x%08X", layer, window->NavLastIds[layer]);
            continue;
        }
        BulletText("NavLastIds[%d]: 0x%08X at +(%.1f,%.1f)(%.1f,%.1f)", layer, window->NavLastIds[layer], r.Min.x, r.Min.y, r.Max.x, r.Max.y);
        if (IsItemHovered())
            GetForegroundDrawList(window)->AddRect(r.Min + window->Pos, r.Max + window->Pos, IM_COL32(255, 255, 0, 255));
    }
    BulletText("NavLayersActiveMask: %X, NavLastChildNavWindow: %s", window->DC.NavLayersActiveMask, window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
    if (window->RootWindow != window)       { DebugNodeWindow(window->RootWindow, "RootWindow"); }
    if (window->ParentWindow != NULL)       { DebugNodeWindow(window->ParentWindow, "ParentWindow"); }
    if (window->DC.ChildWindows.Size > 0)   { DebugNodeWindowsList(&window->DC.ChildWindows, "ChildWindows"); }
    if (window->ColumnsStorage.Size > 0 && TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
    {
        for (int n = 0; n < window->ColumnsStorage.Size; n++)
            DebugNodeColumns(&window->ColumnsStorage[n]);
        TreePop();
    }
    DebugNodeStorage(&window->StateStorage, "Storage");
    TreePop();
}